

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

bool __thiscall SimpleString::equalsNoCase(SimpleString *this,SimpleString *str)

{
  char cVar1;
  char cVar2;
  SimpleString local_30;
  SimpleString local_20;
  
  lowerCase(&local_30);
  lowerCase(&local_20);
  cVar2 = *local_30.buffer_;
  if (cVar2 == '\0') {
    cVar2 = '\0';
  }
  else {
    do {
      local_30.buffer_ = local_30.buffer_ + 1;
      if (cVar2 != *local_20.buffer_) goto LAB_001335d5;
      local_20.buffer_ = local_20.buffer_ + 1;
      cVar2 = *local_30.buffer_;
    } while (cVar2 != '\0');
    cVar2 = '\0';
  }
LAB_001335d5:
  cVar1 = *local_20.buffer_;
  deallocateInternalBuffer(&local_20);
  deallocateInternalBuffer(&local_30);
  return cVar2 == cVar1;
}

Assistant:

bool SimpleString::equalsNoCase(const SimpleString& str) const
{
    return lowerCase() == str.lowerCase();
}